

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O0

string * __thiscall iDynTree::MatrixDynSize::toString_abi_cxx11_(MatrixDynSize *this)

{
  double *pdVar1;
  size_t sVar2;
  ostream *poVar3;
  MatrixDynSize *in_RSI;
  string *in_RDI;
  size_t col;
  size_t row;
  stringstream ss;
  ulong local_1a8;
  ulong local_1a0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0 = 0;
  while( true ) {
    sVar2 = rows(in_RSI);
    if (sVar2 <= local_1a0) break;
    local_1a8 = 0;
    while( true ) {
      sVar2 = cols(in_RSI);
      if (sVar2 <= local_1a8) break;
      pdVar1 = in_RSI->m_data;
      sVar2 = rawIndexRowMajor(in_RSI,local_1a0,local_1a8);
      poVar3 = (ostream *)std::ostream::operator<<(local_188,pdVar1[sVar2]);
      std::operator<<(poVar3," ");
      local_1a8 = local_1a8 + 1;
    }
    std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
    local_1a0 = local_1a0 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string MatrixDynSize::toString() const
{
    std::stringstream ss;

    for(std::size_t row=0; row < this->rows(); row++ )
    {
        for(std::size_t col=0; col < this->cols(); col++ )
        {
            ss << this->m_data[this->rawIndexRowMajor(row,col)] << " ";
        }
        ss << std::endl;
    }

    return ss.str();
}